

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O3

int ARKStepSetOptimalParams(void *arkode_mem)

{
  ARKodeHAdaptMem pAVar1;
  int iVar2;
  realtype rVar3;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_18;
  ARKodeMem local_10;
  
  iVar2 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetOptimalParams",&local_10,&local_18);
  if (iVar2 != 0) {
    return iVar2;
  }
  pAVar1 = local_10->hadapt_mem;
  if (pAVar1 == (ARKodeHAdaptMem)0x0) {
    arkProcessError(local_10,-0x15,"ARKode::ARKStep","ARKStepSetOptimalParams",
                    "Adaptivity memory structure not allocated.");
    return -0x15;
  }
  if (local_18->explicit == 0) {
    if (local_18->implicit == 0) goto LAB_004be63a;
    switch(local_18->q) {
    case 2:
      pAVar1->imethod = 0;
      pAVar1->safety = 0.96;
      pAVar1->bias = 1.5;
      pAVar1->growth = 20.0;
      pAVar1->etamxf = 0.3;
      pAVar1->small_nef = 2;
      pAVar1->etacf = 0.25;
      local_18->nlscoef = 0.001;
      local_18->maxcor = 5;
      local_18->crdown = 0.3;
      local_18->rdiv = 2.3;
      local_18->dgmax = 0.2;
      local_18->msbp = 0x14;
      break;
    case 3:
      pAVar1->imethod = 2;
      pAVar1->safety = 0.957;
      pAVar1->bias = 1.9;
      pAVar1->growth = 17.6;
      pAVar1->etamxf = 0.45;
      pAVar1->small_nef = 2;
      goto LAB_004be8a5;
    case 4:
      pAVar1->imethod = 0;
      pAVar1->safety = 0.988;
      pAVar1->bias = 1.2;
      pAVar1->growth = 31.5;
      pAVar1->k1 = 0.535;
      pAVar1->k2 = 0.209;
      pAVar1->k3 = 0.148;
      rVar3 = 0.33;
      goto LAB_004be78f;
    case 5:
      pAVar1->imethod = 0;
      pAVar1->safety = 0.937;
      pAVar1->bias = 3.3;
      pAVar1->growth = 22.0;
      pAVar1->k1 = 0.56;
      pAVar1->k2 = 0.338;
      pAVar1->k3 = 0.14;
      rVar3 = 0.44;
      goto LAB_004be822;
    }
  }
  else {
    if (local_18->implicit == 0) {
      pAVar1->imethod = 1;
      pAVar1->safety = 0.99;
      pAVar1->bias = 1.2;
      pAVar1->growth = 25.0;
      pAVar1->k1 = 0.8;
      pAVar1->k2 = 0.31;
      pAVar1->etamxf = 0.3;
      return 0;
    }
LAB_004be63a:
    iVar2 = local_18->q;
    if (iVar2 == 5) {
      pAVar1->imethod = 1;
      pAVar1->safety = 0.993;
      pAVar1->bias = 1.15;
      pAVar1->growth = 28.5;
      pAVar1->k1 = 0.8;
      pAVar1->k2 = 0.35;
      rVar3 = 0.3;
LAB_004be822:
      pAVar1->etamxf = rVar3;
      pAVar1->small_nef = 2;
      pAVar1->etacf = 0.25;
      local_18->nlscoef = 0.25;
      local_18->crdown = 0.4;
      local_18->rdiv = 2.3;
      rVar3 = 0.32;
    }
    else {
      if (iVar2 != 4) {
        if (iVar2 != 3) {
          return 0;
        }
        pAVar1->imethod = 0;
        pAVar1->safety = 0.965;
        pAVar1->bias = 1.42;
        pAVar1->growth = 28.7;
        pAVar1->k1 = 0.54;
        pAVar1->k2 = 0.36;
        pAVar1->k3 = 0.14;
        pAVar1->etamxf = 0.46;
        pAVar1->small_nef = 2;
LAB_004be8a5:
        pAVar1->etacf = 0.25;
        local_18->nlscoef = 0.22;
        local_18->crdown = 0.17;
        local_18->rdiv = 2.3;
        local_18->dgmax = 0.19;
        local_18->msbp = 0x3c;
        return 0;
      }
      pAVar1->imethod = 0;
      pAVar1->safety = 0.97;
      pAVar1->bias = 1.35;
      pAVar1->growth = 25.0;
      pAVar1->k1 = 0.543;
      pAVar1->k2 = 0.297;
      pAVar1->k3 = 0.14;
      rVar3 = 0.47;
LAB_004be78f:
      pAVar1->etamxf = rVar3;
      pAVar1->small_nef = 2;
      pAVar1->etacf = 0.25;
      local_18->nlscoef = 0.24;
      local_18->crdown = 0.26;
      local_18->rdiv = 2.3;
      rVar3 = 0.16;
    }
    local_18->dgmax = rVar3;
    local_18->msbp = 0x1f;
  }
  return 0;
}

Assistant:

int ARKStepSetOptimalParams(void *arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetOptimalParams",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* access ARKodeHAdaptMem structure */
  if (ark_mem->hadapt_mem == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepSetOptimalParams",
                    MSG_ARKADAPT_NO_MEM);
    return(ARK_MEM_NULL);
  }
  hadapt_mem = ark_mem->hadapt_mem;

  /* Choose values based on method, order */

  /*    explicit */
  if (step_mem->explicit && !step_mem->implicit) {
    hadapt_mem->imethod = ARK_ADAPT_PI;
    hadapt_mem->safety  = RCONST(0.99);
    hadapt_mem->bias    = RCONST(1.2);
    hadapt_mem->growth  = RCONST(25.0);
    hadapt_mem->k1      = RCONST(0.8);
    hadapt_mem->k2      = RCONST(0.31);
    hadapt_mem->etamxf  = RCONST(0.3);

  /*    implicit */
  } else if (step_mem->implicit && !step_mem->explicit) {
    switch (step_mem->q) {
    case 2:   /* just use standard defaults since better ones unknown */
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = SAFETY;
      hadapt_mem->bias      = BIAS;
      hadapt_mem->growth    = GROWTH;
      hadapt_mem->etamxf    = ETAMXF;
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.001);
      step_mem->maxcor      = 5;
      step_mem->crdown      = CRDOWN;
      step_mem->rdiv        = RDIV;
      step_mem->dgmax       = DGMAX;
      step_mem->msbp        = MSBP;
      break;
    case 3:
      hadapt_mem->imethod   = ARK_ADAPT_I;
      hadapt_mem->safety    = RCONST(0.957);
      hadapt_mem->bias      = RCONST(1.9);
      hadapt_mem->growth    = RCONST(17.6);
      hadapt_mem->etamxf    = RCONST(0.45);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.22);
      step_mem->crdown      = RCONST(0.17);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.19);
      step_mem->msbp        = 60;
      break;
    case 4:
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = RCONST(0.988);
      hadapt_mem->bias      = RCONST(1.2);
      hadapt_mem->growth    = RCONST(31.5);
      hadapt_mem->k1        = RCONST(0.535);
      hadapt_mem->k2        = RCONST(0.209);
      hadapt_mem->k3        = RCONST(0.148);
      hadapt_mem->etamxf    = RCONST(0.33);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.24);
      step_mem->crdown      = RCONST(0.26);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.16);
      step_mem->msbp        = 31;
      break;
    case 5:
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = RCONST(0.937);
      hadapt_mem->bias      = RCONST(3.3);
      hadapt_mem->growth    = RCONST(22.0);
      hadapt_mem->k1        = RCONST(0.56);
      hadapt_mem->k2        = RCONST(0.338);
      hadapt_mem->k3        = RCONST(0.14);
      hadapt_mem->etamxf    = RCONST(0.44);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.25);
      step_mem->crdown      = RCONST(0.4);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.32);
      step_mem->msbp        = 31;
      break;
    }

  /*    imex */
  } else {
    switch (step_mem->q) {
    case 3:
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = RCONST(0.965);
      hadapt_mem->bias      = RCONST(1.42);
      hadapt_mem->growth    = RCONST(28.7);
      hadapt_mem->k1        = RCONST(0.54);
      hadapt_mem->k2        = RCONST(0.36);
      hadapt_mem->k3        = RCONST(0.14);
      hadapt_mem->etamxf    = RCONST(0.46);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.22);
      step_mem->crdown      = RCONST(0.17);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.19);
      step_mem->msbp        = 60;
      break;
    case 4:
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = RCONST(0.97);
      hadapt_mem->bias      = RCONST(1.35);
      hadapt_mem->growth    = RCONST(25.0);
      hadapt_mem->k1        = RCONST(0.543);
      hadapt_mem->k2        = RCONST(0.297);
      hadapt_mem->k3        = RCONST(0.14);
      hadapt_mem->etamxf    = RCONST(0.47);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.24);
      step_mem->crdown      = RCONST(0.26);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.16);
      step_mem->msbp        = 31;
      break;
    case 5:
      hadapt_mem->imethod   = ARK_ADAPT_PI;
      hadapt_mem->safety    = RCONST(0.993);
      hadapt_mem->bias      = RCONST(1.15);
      hadapt_mem->growth    = RCONST(28.5);
      hadapt_mem->k1        = RCONST(0.8);
      hadapt_mem->k2        = RCONST(0.35);
      hadapt_mem->etamxf    = RCONST(0.3);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.25);
      step_mem->crdown      = RCONST(0.4);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.32);
      step_mem->msbp        = 31;
      break;
    }

  }
  return(ARK_SUCCESS);
}